

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControllerWidget::mouseMoveEvent(ControllerWidget *this,QMouseEvent *event)

{
  SubControl SVar1;
  long in_FS_OFFSET;
  QPointF local_28;
  QPoint local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_18 = QPointF::toPoint(&local_28);
  SVar1 = getSubControl(this,&local_18);
  if (this->hoverControl != SVar1) {
    this->hoverControl = SVar1;
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mouseMoveEvent(QMouseEvent *event)
{
    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    //test if hover state changes
    if (hoverControl != under_mouse) {
        hoverControl = under_mouse;
        update();
    }
}